

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

QStringList * parseIfMatch(QStringList *__return_storage_ptr__,QByteArrayView raw)

{
  QLatin1String QVar1;
  storage_type *psVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QLatin1String QVar4;
  undefined1 auVar5 [16];
  iterator __begin1;
  QString local_90;
  undefined1 local_78 [32];
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QStringTokenizerBase<QLatin1String,_QChar> local_40;
  QStringList *local_20;
  
  local_20 = *(QStringList **)(in_FS_OFFSET + 0x28);
  QVar4 = (QLatin1String)QtPrivate::trimmed(raw);
  if ((QVar4.m_size == 1) && (*QVar4.m_data == '*')) {
    local_78._0_8_ = (QStringTokenizerBase<QLatin1String,_QChar> *)0x0;
    local_78._8_8_ = L"*";
    local_78._16_8_ = (char *)0x1;
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)__return_storage_ptr__,0,(QString *)local_78);
    QList<QString>::end(__return_storage_ptr__);
    QVar1.m_data = local_40.m_haystack.m_data;
    QVar1.m_size = local_40.m_haystack.m_size;
    if ((QStringTokenizerBase<QLatin1String,_QChar> *)local_78._0_8_ !=
        (QStringTokenizerBase<QLatin1String,_QChar> *)0x0) {
      LOCK();
      ((__atomic_base<int> *)
      &(((QStringTokenizerBaseBase *)local_78._0_8_)->m_sb).
       super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i =
           ((__atomic_base<int> *)
           &(((QStringTokenizerBaseBase *)local_78._0_8_)->m_sb).
            super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i + -1;
      UNLOCK();
      local_40.m_haystack = QVar1;
      if (((__atomic_base<int> *)
          &(((QStringTokenizerBaseBase *)local_78._0_8_)->m_sb).
           super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_40.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_40.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_40.m_needle.ucs = L',';
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_40.m_haystack = QVar4;
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)local_78,&local_40);
    if (local_78[0x18] == true) {
      do {
        QVar4.m_data = (char *)local_78._16_8_;
        QVar4.m_size = local_78._8_8_;
        auVar5 = QtPrivate::trimmed(QVar4);
        psVar2 = auVar5._0_8_;
        if (((psVar2 != (storage_type *)0x0) && (*auVar5._8_8_ == '\"')) &&
           ((auVar5._8_8_ + -1)[(long)psVar2] == '\"')) {
          QVar3.m_data = psVar2;
          QVar3.m_size = (qsizetype)&local_90;
          QString::fromLatin1(QVar3);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_90);
          QList<QString>::end(__return_storage_ptr__);
          if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_78);
      } while (local_78[0x18] != false);
    }
  }
  if (*(QStringList **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(QStringList **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QStringList parseIfMatch(QByteArrayView raw)
{
    return parseMatchImpl(raw, [](QByteArrayView element) {
        return element.startsWith('"') && element.endsWith('"');
    });
}